

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_rff.cpp
# Opt level: O3

FResourceFile * CheckRFF(char *filename,FileReader *file,bool quiet)

{
  bool bVar1;
  FRFFFile *this;
  char head [4];
  int local_2c;
  
  if (0xf < file->Length) {
    (*(file->super_FileReaderBase)._vptr_FileReaderBase[4])(file,0,0);
    (*(file->super_FileReaderBase)._vptr_FileReaderBase[2])(file,&local_2c,4);
    (*(file->super_FileReaderBase)._vptr_FileReaderBase[4])(file,0,0);
    if (local_2c != 0x1a464652) {
      return (FResourceFile *)0x0;
    }
    this = (FRFFFile *)operator_new(0x28);
    FResourceFile::FResourceFile((FResourceFile *)this,filename,file);
    (this->super_FResourceFile)._vptr_FResourceFile = (_func_int **)&PTR__FRFFFile_007092f8;
    this->Lumps = (FRFFLump *)0x0;
    bVar1 = FRFFFile::Open(this,quiet);
    if (bVar1) {
      return &this->super_FResourceFile;
    }
    (this->super_FResourceFile).Reader = (FileReader *)0x0;
    (*(this->super_FResourceFile)._vptr_FResourceFile[1])(this);
  }
  return (FResourceFile *)0x0;
}

Assistant:

FResourceFile *CheckRFF(const char *filename, FileReader *file, bool quiet)
{
	char head[4];

	if (file->GetLength() >= 16)
	{
		file->Seek(0, SEEK_SET);
		file->Read(&head, 4);
		file->Seek(0, SEEK_SET);
		if (!memcmp(head, "RFF\x1a", 4))
		{
			FResourceFile *rf = new FRFFFile(filename, file);
			if (rf->Open(quiet)) return rf;

			rf->Reader = NULL; // to avoid destruction of reader
			delete rf;
		}
	}
	return NULL;
}